

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

void __thiscall
SimpleStringBuffer::addMemoryDump(SimpleStringBuffer *this,void *memory,size_t memorySize)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  for (uVar3 = 0; uVar4 = memorySize - uVar3, uVar3 <= memorySize && uVar4 != 0;
      uVar3 = uVar3 + uVar7) {
    add(this,"    %04lx: ",uVar3);
    uVar7 = 0x10;
    if (uVar4 < 0x10) {
      uVar7 = uVar4;
    }
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      add(this,"%02hx ",(ulong)*(byte *)((long)memory + uVar5 + uVar3));
      if (uVar5 == 7) {
        add(this," ");
      }
    }
    for (lVar6 = uVar7 - 0x10; lVar6 != 0; lVar6 = lVar6 + 1) {
      add(this,"   ");
    }
    if (uVar4 < 8) {
      add(this," ");
    }
    add(this,"|");
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      cVar1 = *(char *)((long)memory + uVar4 + uVar3);
      cVar2 = '.';
      if (0xa0 < (byte)(cVar1 + 0x81U)) {
        cVar2 = cVar1;
      }
      add(this,"%c",(ulong)(uint)(int)cVar2);
    }
    add(this,"|\n");
  }
  return;
}

Assistant:

void SimpleStringBuffer::addMemoryDump(const void* memory, size_t memorySize)
{
    const unsigned char* byteMemory = (const unsigned char*)memory;
    const size_t maxLineBytes = 16;
    size_t currentPos = 0;
    size_t p;

    while (currentPos < memorySize) {
        add("    %04lx: ", (unsigned long) currentPos);
        size_t bytesInLine = memorySize - currentPos;
        if (bytesInLine > maxLineBytes) {
            bytesInLine = maxLineBytes;
        }
        const size_t leftoverBytes = maxLineBytes - bytesInLine;

        for (p = 0; p < bytesInLine; p++) {
            add("%02hx ", (unsigned short) byteMemory[currentPos + p]);
            if (p == ((maxLineBytes / 2) - 1)) {
                add(" ");
            }
        }
        for (p = 0; p < leftoverBytes; p++) {
            add("   ");
        }
        if (leftoverBytes > (maxLineBytes/2)) {
            add(" ");
        }

        add("|");
        for (p = 0; p < bytesInLine; p++) {
            char toAdd = (char)byteMemory[currentPos + p];
            if (toAdd < ' ' || toAdd > '~') {
                toAdd = '.';
            }
            add("%c", (int)toAdd);
        }
        add("|\n");
        currentPos += bytesInLine;
    }
}